

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O2

_Bool run_container_intersect(run_container_t *src_1,run_container_t *src_2)

{
  rle16_t *prVar1;
  rle16_t *prVar2;
  _Bool _Var3;
  _Bool _Var4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  
  _Var3 = run_container_is_full(src_1);
  _Var4 = run_container_is_full(src_2);
  if (_Var4 || _Var3) {
    if (_Var3) {
      src_1 = src_2;
    }
    _Var3 = src_1->n_runs != 0;
  }
  else {
    prVar1 = src_1->runs;
    uVar5 = (uint)prVar1->value;
    uVar7 = (uint)prVar1->value + (uint)prVar1->length + 1;
    prVar2 = src_2->runs;
    uVar6 = (uint)prVar2->value;
    uVar10 = (uint)prVar2->value + (uint)prVar2->length + 1;
    iVar8 = 0;
    iVar9 = 0;
    while ((iVar8 < src_1->n_runs && (iVar9 < src_2->n_runs))) {
      if (uVar6 < uVar7) {
        if (uVar5 < uVar10) {
          return true;
        }
        iVar9 = iVar9 + 1;
        if (iVar9 < src_2->n_runs) {
          uVar6 = (uint)prVar2[iVar9].value;
          uVar10 = prVar2[iVar9].length + uVar6 + 1;
        }
      }
      else {
        iVar8 = iVar8 + 1;
        if (iVar8 < src_1->n_runs) {
          uVar5 = (uint)prVar1[iVar8].value;
          uVar7 = prVar1[iVar8].length + uVar5 + 1;
        }
      }
    }
    _Var3 = false;
  }
  return _Var3;
}

Assistant:

bool run_container_intersect(const run_container_t *src_1,
                             const run_container_t *src_2) {
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            return !run_container_empty(src_2);
        }
        if (if2) {
            return !run_container_empty(src_1);
        }
    }
    int32_t rlepos = 0;
    int32_t xrlepos = 0;
    int32_t start = src_1->runs[rlepos].value;
    int32_t end = start + src_1->runs[rlepos].length + 1;
    int32_t xstart = src_2->runs[xrlepos].value;
    int32_t xend = xstart + src_2->runs[xrlepos].length + 1;
    while ((rlepos < src_1->n_runs) && (xrlepos < src_2->n_runs)) {
        if (end <= xstart) {
            ++rlepos;
            if (rlepos < src_1->n_runs) {
                start = src_1->runs[rlepos].value;
                end = start + src_1->runs[rlepos].length + 1;
            }
        } else if (xend <= start) {
            ++xrlepos;
            if (xrlepos < src_2->n_runs) {
                xstart = src_2->runs[xrlepos].value;
                xend = xstart + src_2->runs[xrlepos].length + 1;
            }
        } else {  // they overlap
            return true;
        }
    }
    return false;
}